

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<kj::AuthenticatedStream> __thiscall
kj::anon_unknown_123::AggregateConnectionReceiver::acceptAuthenticated
          (AggregateConnectionReceiver *this)

{
  undefined8 *puVar1;
  long *plVar2;
  long lVar3;
  void *pvVar4;
  Promise<kj::AuthenticatedStream> *result;
  size_t in_RSI;
  long lVar5;
  long lVar6;
  ConnectionReceiver local_38;
  
  puVar1 = *(undefined8 **)(in_RSI + 0x60);
  if (*(undefined8 **)(in_RSI + 0x80) == puVar1) {
    pvVar4 = operator_new(0x400);
    *(undefined8 *)((long)pvVar4 + 0x208) = 0;
    *(undefined ***)((long)pvVar4 + 0x1f8) = &PTR_destroy_0059b1e8;
    *(undefined ***)((long)pvVar4 + 0x210) = &PTR_reject_0059b238;
    lVar6 = 0;
    *(undefined1 *)((long)pvVar4 + 0x218) = 0;
    *(undefined1 *)((long)pvVar4 + 0x3b0) = 0;
    *(undefined1 *)((long)pvVar4 + 0x3d8) = 1;
    *(long *)((long)pvVar4 + 0x3e0) = (long)pvVar4 + 0x210;
    *(size_t *)((long)pvVar4 + 1000) = in_RSI;
    *(undefined8 *)((long)pvVar4 + 0x3f0) = 0;
    plVar2 = *(long **)(in_RSI + 0x40);
    *plVar2 = (long)pvVar4 + 0x3e0;
    *(long **)((long)pvVar4 + 0x3f8) = plVar2;
    *(long *)(in_RSI + 0x40) = (long)pvVar4 + 0x3f0;
    *(long *)(in_RSI + 0x48) = *(long *)(in_RSI + 0x48) + 1;
    *(void **)((long)pvVar4 + 0x200) = pvVar4;
    (this->super_ConnectionReceiver)._vptr_ConnectionReceiver = (_func_int **)((long)pvVar4 + 0x1f8)
    ;
    local_38._vptr_ConnectionReceiver = (_func_int **)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xffffffffffffffc8);
    lVar3 = *(long *)(in_RSI + 0x10);
    for (lVar5 = 0; lVar3 != lVar5; lVar5 = lVar5 + 1) {
      if (*(char *)(*(long *)(in_RSI + 0x20) + lVar6) == '\0') {
        acceptLoop((AggregateConnectionReceiver *)&stack0xffffffffffffffc8,in_RSI);
        kj::_::NullableValue<kj::Promise<void>>::emplace<kj::Promise<void>>
                  ((NullableValue<kj::Promise<void>> *)(*(long *)(in_RSI + 0x20) + lVar6),
                   (Promise<void> *)&stack0xffffffffffffffc8);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xffffffffffffffc8);
      }
      lVar6 = lVar6 + 0x10;
    }
  }
  else {
    (this->super_ConnectionReceiver)._vptr_ConnectionReceiver = (_func_int **)*puVar1;
    *puVar1 = 0;
    std::
    deque<kj::Promise<kj::AuthenticatedStream>,_std::allocator<kj::Promise<kj::AuthenticatedStream>_>_>
    ::pop_front((deque<kj::Promise<kj::AuthenticatedStream>,_std::allocator<kj::Promise<kj::AuthenticatedStream>_>_>
                 *)(in_RSI + 0x50));
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<AuthenticatedStream> acceptAuthenticated() override {
    // Whenever our accept() is called, we want it to resolve to the first connection accepted by
    // any of our child receivers. Naively, it may seem like we should call accept() on them all
    // and exclusiveJoin() the results. Unfortunately, this might not work in a certain race
    // condition: if two or more of our children receive connections simultaneously, both child
    // accept() calls may return, but we'll only end up taking one and dropping the other.
    //
    // To avoid this problem, we must instead initiate `accept()` calls on all children, and even
    // after one of them returns a result, we must allow the others to keep running. If we end up
    // accepting any sockets from children when there is no outstanding accept() on the aggregate,
    // we must put that socket into a backlog. We only restart accept() calls on children if the
    // backlog is empty, and hence the maximum length of the backlog is the number of children
    // minus 1.

    if (backlog.empty()) {
      auto result = kj::newAdaptedPromise<AuthenticatedStream, Waiter>(*this);
      ensureAllAccepting();
      return result;
    } else {
      auto result = kj::mv(backlog.front());
      backlog.pop_front();
      return result;
    }
  }